

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O2

void ErrorOutOfBoundsWrap(CodeGenRegVmStateContext *vmState)

{
  CodeGenRegVmContext *pCVar1;
  CodeGenRegVmCallStackEntry *pCVar2;
  
  pCVar1 = vmState->ctx;
  pCVar2 = vmState->callStackTop;
  pCVar2->instruction = vmState->callInstructionPos + 1;
  vmState->callStackTop = pCVar2 + 1;
  ExecutorX86::Stop(pCVar1->x86rvm,"ERROR: array index out of bounds");
  longjmp((__jmp_buf_tag *)vmState,1);
}

Assistant:

void ErrorOutOfBoundsWrap(CodeGenRegVmStateContext *vmState)
{
	CodeGenRegVmContext &ctx = *vmState->ctx;

	vmState->callStackTop->instruction = vmState->callInstructionPos + 1;
	vmState->callStackTop++;

	ctx.x86rvm->Stop("ERROR: array index out of bounds");
	longjmp(vmState->errorHandler, 1);
}